

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O0

void anon_unknown.dwarf_1d741c::writePixels
               (char *pFilename,int *pImageHeight,int *pImageWidth,Array2D<Imath_3_2::half> *pPixels
               ,Array2D<Imath_3_2::half> *pPixelsLeft,int pNbChannels,Compression pCompression)

{
  int iVar1;
  Channel *pCVar2;
  Slice *pSVar3;
  int iVar4;
  char *pcVar5;
  half *phVar6;
  Array2D<Imath_3_2::half> *in_RCX;
  int *in_RDX;
  int *in_RSI;
  char *in_RDI;
  Array2D<Imath_3_2::half> *in_R8;
  int in_R9D;
  Compression in_stack_00000008;
  int i_1;
  FrameBuffer lOutputFrameBuffer;
  OutputFile lFile;
  StringVector multiView;
  int i;
  Header header;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  Slice *in_stack_fffffffffffffdc0;
  allocator<char> *in_stack_fffffffffffffde0;
  allocator<char> *__a;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  Slice local_1e8 [56];
  Slice local_1b0 [60];
  int local_174;
  char local_170 [48];
  undefined1 local_140 [55];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [60];
  Channel local_a4 [16];
  Channel local_94 [32];
  int local_74;
  Vec2<float> local_70;
  Header local_68 [60];
  int local_2c;
  Array2D<Imath_3_2::half> *local_28;
  Array2D<Imath_3_2::half> *local_20;
  int *local_18;
  char *local_8;
  
  iVar4 = *in_RDX;
  iVar1 = *in_RSI;
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  Imath_3_2::Vec2<float>::Vec2(&local_70,0.0,0.0);
  Imf_3_4::Header::Header
            (local_68,iVar4,iVar1,1.0,(Vec2 *)&local_70,1.0,INCREASING_Y,in_stack_00000008);
  for (local_74 = 0; local_74 < local_2c; local_74 = local_74 + 1) {
    pcVar5 = (char *)Imf_3_4::Header::channels();
    pCVar2 = *(Channel **)((anonymous_namespace)::CHANNEL_NAMES + (long)local_74 * 8);
    Imf_3_4::Channel::Channel(local_94,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar5,pCVar2);
    pcVar5 = (char *)Imf_3_4::Header::channels();
    in_stack_fffffffffffffdf0 =
         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
          ((anonymous_namespace)::CHANNEL_NAMES_LEFT + (long)local_74 * 8);
    Imf_3_4::Channel::Channel(local_a4,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar5,(Channel *)in_stack_fffffffffffffdf0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1e1add);
  __s = &local_e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdf0,(char *)__s,in_stack_fffffffffffffde0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
              (value_type *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  __a = &local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffdf0,(char *)__s,__a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
              (value_type *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::
  TypedAttribute((vector *)(local_140 + 0x10));
  Imf_3_4::Header::insert((char *)local_68,(Attribute *)"multiView");
  Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::
  ~TypedAttribute((TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   *)(local_140 + 0x10));
  iVar4 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile((OutputFile *)local_140,local_8,local_68,iVar4);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x1e1c20);
  for (local_174 = 0; local_174 < local_2c; local_174 = local_174 + 1) {
    pSVar3 = *(Slice **)((anonymous_namespace)::CHANNEL_NAMES + (long)local_174 * 8);
    phVar6 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](local_20,0);
    Imf_3_4::Slice::Slice
              (local_1b0,HALF,(char *)(phVar6 + local_174),(long)local_2c * 2,
               (long)local_2c * 2 * (long)*local_18,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert(local_170,pSVar3);
    in_stack_fffffffffffffdc0 =
         *(Slice **)((anonymous_namespace)::CHANNEL_NAMES_LEFT + (long)local_174 * 8);
    phVar6 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](local_28,0);
    Imf_3_4::Slice::Slice
              (local_1e8,HALF,(char *)(phVar6 + local_174),(long)local_2c * 2,
               (long)local_2c * 2 * (long)*local_18,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert(local_170,in_stack_fffffffffffffdc0);
  }
  Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)local_140);
  Imf_3_4::OutputFile::writePixels((int)local_140);
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1e1ecf);
  Imf_3_4::OutputFile::~OutputFile((OutputFile *)local_140);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffdc0);
  Imf_3_4::Header::~Header(local_68);
  return;
}

Assistant:

void
writePixels (
    const char     pFilename[],
    const int&     pImageHeight,
    const int&     pImageWidth,
    Array2D<half>& pPixels,
    Array2D<half>& pPixelsLeft,
    int            pNbChannels,
    Compression    pCompression)
{
    Header header (
        pImageWidth,
        pImageHeight,
        1.0f,
        V2f (0.0f, 0.0f),
        1.0f,
        INCREASING_Y,
        pCompression);
    for (int i = 0; i < pNbChannels; ++i)
    {
        header.channels ().insert (CHANNEL_NAMES[i], Channel (HALF));
        header.channels ().insert (CHANNEL_NAMES_LEFT[i], Channel (HALF));
    }

    StringVector multiView;
    multiView.push_back ("right");
    multiView.push_back ("left");
    header.insert (
        "multiView", IMF::TypedAttribute<IMF::StringVector> (multiView));

    OutputFile  lFile (pFilename, header);
    FrameBuffer lOutputFrameBuffer;

    for (int i = 0; i < pNbChannels; ++i)
    {
        lOutputFrameBuffer.insert (
            CHANNEL_NAMES[i],
            Slice (
                HALF,
                (char*) &pPixels[0][i],
                sizeof (pPixels[0][0]) * pNbChannels,
                sizeof (pPixels[0][0]) * pNbChannels * pImageWidth));

        lOutputFrameBuffer.insert (
            CHANNEL_NAMES_LEFT[i],
            Slice (
                HALF,
                (char*) &pPixelsLeft[0][i],
                sizeof (pPixelsLeft[0][0]) * pNbChannels,
                sizeof (pPixelsLeft[0][0]) * pNbChannels * pImageWidth));
    }

    lFile.setFrameBuffer (lOutputFrameBuffer);
    lFile.writePixels (pImageHeight);
}